

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void do_olc(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  CHAR_DATA *in_RDI;
  int cmd;
  char command [4608];
  char *in_stack_00002408;
  CHAR_DATA *in_stack_00002410;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffede0;
  undefined4 in_stack_ffffffffffffede4;
  int iVar3;
  char local_1218;
  char *in_stack_ffffffffffffee00;
  char *in_stack_ffffffffffffee08;
  
  bVar1 = check_security(in_stack_ffffffffffffedd8);
  if (bVar1) {
    pcVar2 = one_argument((char *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                          (char *)in_stack_ffffffffffffedd8);
    if (local_1218 == '\0') {
      do_help(in_stack_00002410,in_stack_00002408);
    }
    else {
      iVar3 = 0;
      while (editor_table[iVar3].name != (char *)0x0) {
        bVar1 = str_prefix(in_stack_ffffffffffffee08,in_stack_ffffffffffffee00);
        if (!bVar1) {
          (*editor_table[iVar3].do_fun)(in_RDI,pcVar2);
          return;
        }
        iVar3 = iVar3 + 1;
      }
      do_help(in_stack_00002410,in_stack_00002408);
    }
  }
  return;
}

Assistant:

void do_olc(CHAR_DATA *ch, char *argument)
{
	char command[MAX_INPUT_LENGTH];
	int cmd;

	if (!check_security(ch))
		return;

	argument = one_argument(argument, command);

	if (command[0] == '\0')
	{
		do_help(ch, "olc");
		return;
	}

	/* Search Table and Dispatch Command. */
	for (cmd = 0; editor_table[cmd].name != nullptr; cmd++)
	{
		if (!str_prefix(command, editor_table[cmd].name))
		{
			(*editor_table[cmd].do_fun)(ch, argument);
			return;
		}
	}

	/* Invalid command, send help. */
	do_help(ch, "olc");
}